

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.h
# Opt level: O2

QString * __thiscall
QCborStreamReader::readAllString(QString *__return_storage_ptr__,QCborStreamReader *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  bVar1 = _readAndAppendToString_helper(this,__return_storage_ptr__);
  if (!bVar1) {
    local_38.d = (__return_storage_ptr__->d).d;
    local_38.ptr = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    local_38.size = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString readAllString()
    {
        QString dst;
        if (!readAndAppendToString(dst))
            dst = QString{};
        return dst;
    }